

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  ssize_t extraout_RAX;
  format_error *this_00;
  ulong uVar2;
  undefined4 in_register_00000034;
  char *__s;
  size_t size;
  str_writer<char> f;
  
  __s = (char *)CONCAT44(in_register_00000034,__fd);
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    uVar2 = (ulong)this->specs_->precision_;
    size = sVar1;
    if (uVar2 < sVar1) {
      size = uVar2;
    }
    if ((long)uVar2 < 0) {
      size = sVar1;
    }
    f.size = size;
    f.s = __s;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,size,&this->specs_->super_align_spec,f);
    return extraout_RAX;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this_00,"string pointer is null");
  __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void write(const char_type *value) {
    if (!value)
      FMT_THROW(format_error("string pointer is null"));
    auto length = std::char_traits<char_type>::length(value);
    writer_.write_str(basic_string_view<char_type>(value, length), specs_);
  }